

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

LogicalType *
duckdb::LogicalType::Deserialize(LogicalType *__return_storage_ptr__,Deserializer *deserializer)

{
  LogicalTypeId id;
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_48;
  shared_ptr<duckdb::ExtraTypeInfo,_true> type_info;
  
  id = Deserializer::ReadProperty<duckdb::LogicalTypeId>(deserializer,100,"id");
  Deserializer::ReadPropertyWithDefault<duckdb::shared_ptr<duckdb::ExtraTypeInfo,true>>
            ((Deserializer *)&type_info,(field_id_t)deserializer,(char *)0x65);
  local_48.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       type_info.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_48.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       type_info.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  type_info.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  type_info.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LogicalType(__return_storage_ptr__,id,&local_48);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&type_info.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

LogicalType LogicalType::Deserialize(Deserializer &deserializer) {
	auto id = deserializer.ReadProperty<LogicalTypeId>(100, "id");
	auto type_info = deserializer.ReadPropertyWithDefault<shared_ptr<ExtraTypeInfo>>(101, "type_info");
	LogicalType result(id, std::move(type_info));
	return result;
}